

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importsource.cpp
# Opt level: O2

string * __thiscall
libcellml::ImportSource::url_abi_cxx11_(string *__return_storage_ptr__,ImportSource *this)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)((this->super_Entity).mPimpl + 1));
  return __return_storage_ptr__;
}

Assistant:

std::string ImportSource::url() const
{
    return pFunc()->mUrl;
}